

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 __thiscall
mprpc::MpRpcClient::asnyc_call_abi_cxx11_
          (MpRpcClient *this,char *method,char *params,size_t params_size,int timeout_ms)

{
  int *piVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  MpRpcClient *pMVar6;
  undefined4 in_register_00000084;
  undefined4 in_R9D;
  shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  prom;
  MessageLoop *local_c8;
  __shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_c0;
  int local_b0;
  undefined4 uStack_ac;
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  local_a8;
  MpRpcClient *local_90;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> msg;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  MsgPackPacker pk;
  
  LOCK();
  piVar1 = (int *)(method + 0x548);
  iVar2 = *piVar1;
  *piVar1 = *piVar1 + 1;
  UNLOCK();
  pk.sb.size = 0;
  pk.sb.data = (char *)0x0;
  pk.sb.alloc = 0;
  pk.pk.callback = msgpack_sbuffer_write;
  local_c8 = (MessageLoop *)CONCAT71(local_c8._1_7_,0x83);
  local_90 = this;
  pk.pk.data = &pk;
  msgpack_sbuffer_write(&pk,(char *)&local_c8,1);
  MsgPackPacker::pack_map_item(&pk,"id",iVar2 + 1);
  MsgPackPacker::pack_map_item(&pk,"method",params);
  MsgPackPacker::pack_map_item_obj
            (&pk,"params",(char *)params_size,CONCAT44(in_register_00000084,timeout_ms));
  std::make_shared<std::__cxx11::string,char*&,unsigned_long&>
            ((char **)&msg,(unsigned_long *)&pk.sb.data);
  local_c8 = (MessageLoop *)(method + 0x10);
  std::
  make_shared<loop::Promise<mprpc::MpRpcMessage,std::pair<int,std::__cxx11::string>>,loop::MessageLoop*>
            ((MessageLoop **)&prom);
  local_c8 = (MessageLoop *)method;
  std::
  __shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_c0,
                 &prom.
                  super___shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_b0 = iVar2 + 1;
  uStack_ac = in_R9D;
  std::
  __shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_a8,
                 &msg.
                  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x30);
  _Var5._M_pi = local_a8._M_refcount._M_pi;
  peVar4 = local_a8._M_ptr;
  _Var3._M_pi = _Stack_c0._M_refcount._M_pi;
  *(MessageLoop **)local_78._M_unused._0_8_ = local_c8;
  *(element_type **)((long)local_78._M_unused._0_8_ + 8) = _Stack_c0._M_ptr;
  _Stack_c0._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_c0._M_ptr = (element_type *)0x0;
  local_a8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x10) =
       _Var3._M_pi;
  local_a8._M_ptr = (element_type *)0x0;
  *(ulong *)((long)local_78._M_unused._0_8_ + 0x18) = CONCAT44(uStack_ac,local_b0);
  *(element_type **)((long)local_78._M_unused._0_8_ + 0x20) = peVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x28) =
       _Var5._M_pi;
  pcStack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:232:36)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:232:36)>
             ::_M_manager;
  loop::MessageLoop::post_task((MessageLoop *)(method + 0x10),(Closure *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  asnyc_call[abi:cxx11](char_const*,char_const*,unsigned_long,int)::$_0::~__0((__0 *)&local_c8);
  pMVar6 = local_90;
  loop::
  Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get_future((Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&prom.
              super___shared_ptr<loop::Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&msg.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  free(pk.sb.data);
  return (Future<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(Promise<mprpc::MpRpcMessage,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pMVar6;
}

Assistant:

Future<MpRpcMessage, pair<int, string>> MpRpcClient::asnyc_call(const char* method, const char* params, size_t params_size, int timeout_ms)
    {
        int callid = ++m_cur_callid;
        MsgPackPacker pk;
        pk.pack_map(3);
        pk.pack_map_item("id", callid);
        pk.pack_map_item("method", method);
        pk.pack_map_item_obj("params", params, params_size);

        auto msg = make_shared<string>(pk.sb.data, pk.sb.size);
        auto prom = make_shared<AsyncCallPromise>(&this->m_msg_loop);

        this->msg_loop().post_task([this, prom, callid, timeout_ms, msg]() {
            m_conn->send(msg->data(), msg->size());
            m_on_rsp_map[callid] = OnRspHandler(prom, system_clock::now() + milliseconds(timeout_ms));
        });
        return prom->get_future();
    }